

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float fVar10;
  
  if (((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly == true) && ((window->Flags & 1) == 0)) {
    fVar10 = (window->Size).x;
    fVar3 = ImGuiWindow::TitleBarHeight(window);
    IVar9.y = fVar3;
    IVar9.x = fVar10;
    fVar10 = extraout_XMM0_Db;
  }
  else {
    IVar9 = window->Size;
    fVar10 = 0.0;
  }
  fVar3 = (*padding).x;
  auVar5._0_4_ = (rect->Max).x - fVar3;
  fVar4 = (*padding).y;
  auVar5._4_4_ = (rect->Max).y - fVar4;
  auVar5._8_8_ = 0;
  fVar7 = (window->Pos).x + IVar9.x;
  fVar8 = (window->Pos).y + IVar9.y;
  fVar3 = (rect->Min).x + fVar3;
  fVar4 = (rect->Min).y + fVar4;
  uVar1 = -(uint)(fVar3 <= fVar7);
  uVar2 = -(uint)(fVar4 <= fVar8);
  auVar6._0_4_ = (float)(~uVar1 & (uint)fVar3 | (uint)fVar7 & uVar1) - IVar9.x;
  auVar6._4_4_ = (float)(~uVar2 & (uint)fVar4 | (uint)fVar8 & uVar2) - IVar9.y;
  auVar6._8_4_ = 0;
  auVar6._12_4_ = (float)((uint)(fVar10 + 0.0) & -(uint)(0.0 <= fVar10 + 0.0)) - fVar10;
  auVar5 = minps(auVar5,auVar6);
  window->Pos = auVar5._0_8_;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}